

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::PropertyTable::PropertyTable
          (PropertyTable *this,Element *element,
          shared_ptr<const_Assimp::FBX::PropertyTable> *templateProps)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  mapped_type pEVar4;
  int iVar5;
  Scope *pSVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  mapped_type *ppEVar9;
  Token *t;
  _Rb_tree_header *p_Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  _Base_ptr local_38;
  
  local_38 = &(this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_38;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_38;
  (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var10 = &(this->props)._M_t._M_impl.super__Rb_tree_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
  (this->props)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->templateProps).
  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (templateProps->
       super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (templateProps->
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->templateProps).
  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->element = element;
  pSVar6 = GetRequiredScope(element);
  p_Var8 = (pSVar6->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(pSVar6->elements)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var10) {
    paVar1 = &local_58.field_2;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(p_Var8 + 1));
      if (iVar5 == 0) {
        puVar3 = *(undefined8 **)(*(long *)(p_Var8 + 2) + 8);
        if ((ulong)(*(long *)(*(long *)(p_Var8 + 2) + 0x10) - (long)puVar3) < 0x20) {
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_dataplus._M_p = (pointer)paVar1;
LAB_005c7a24:
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"could not read property name","");
          Util::DOMWarning(&local_78,*(Element **)(p_Var8 + 2));
        }
        else {
          ParseTokenAsString_abi_cxx11_(&local_58,(FBX *)*puVar3,t);
          if (local_58._M_string_length == 0) goto LAB_005c7a24;
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                          *)this,&local_58);
          if (iVar7._M_node == local_38) {
            pEVar4 = *(mapped_type *)(p_Var8 + 2);
            ppEVar9 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Element_*>_>_>
                      ::operator[](&this->lazyProps,&local_58);
            *ppEVar9 = pEVar4;
            goto LAB_005c7a71;
          }
          std::operator+(&local_78,"duplicate property name, will hide previous value: ",&local_58);
          Util::DOMWarning(&local_78,*(Element **)(p_Var8 + 2));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"expected only P elements in property table","");
        Util::DOMWarning(&local_58,*(Element **)(p_Var8 + 2));
      }
LAB_005c7a71:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var10);
  }
  return;
}

Assistant:

PropertyTable::PropertyTable(const Element& element, std::shared_ptr<const PropertyTable> templateProps)
: templateProps(templateProps)
, element(&element)
{
    const Scope& scope = GetRequiredScope(element);
    for(const ElementMap::value_type& v : scope.Elements()) {
        if(v.first != "P") {
            DOMWarning("expected only P elements in property table",v.second);
            continue;
        }

        const std::string& name = PeekPropertyName(*v.second);
        if(!name.length()) {
            DOMWarning("could not read property name",v.second);
            continue;
        }

        LazyPropertyMap::const_iterator it = lazyProps.find(name);
        if (it != lazyProps.end()) {
            DOMWarning("duplicate property name, will hide previous value: " + name,v.second);
            continue;
        }

        lazyProps[name] = v.second;
    }
}